

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::Btree_KeyCompareToAdapter_Test::~Btree_KeyCompareToAdapter_Test
          (Btree_KeyCompareToAdapter_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, KeyCompareToAdapter) {
        AssertKeyCompareToAdapted<std::less<std::string>, std::string>();
        AssertKeyCompareToAdapted<std::greater<std::string>, std::string>();
#if PHMAP_HAVE_STD_STRING_VIEW
        AssertKeyCompareToAdapted<std::less<std::string_view>, std::string_view>();
        AssertKeyCompareToAdapted<std::greater<std::string_view>,
                                  std::string_view>();
#endif
        AssertKeyCompareToNotAdapted<std::less<int>, int>();
        AssertKeyCompareToNotAdapted<std::greater<int>, int>();
    }